

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

int luaL_execresult(lua_State *L,int stat)

{
  long lVar1;
  double *pdVar2;
  uint in_ESI;
  size_t in_RDI;
  lua_State *unaff_retaddr;
  uint local_1c;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  undefined4 in_stack_fffffffffffffff4;
  lua_State *in_stack_fffffffffffffff8;
  
  if (in_ESI == 0xffffffff) {
    iVar3 = luaL_fileresult(unaff_retaddr,(int)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                            (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  }
  else {
    if ((char)(((byte)in_ESI & 0x7f) + 1) >> 1 < '\x01') {
      local_1c = in_ESI;
      if ((in_ESI & 0x7f) == 0) {
        local_1c = (int)(in_ESI & 0xff00) >> 8;
      }
      if (local_1c == 0) {
        lVar1 = *(long *)(in_RDI + 0x18);
        *(long *)(in_RDI + 0x18) = lVar1 + 8;
        *(undefined4 *)(lVar1 + 4) = 0xfffffffd;
      }
      else {
        lVar1 = *(long *)(in_RDI + 0x18);
        *(long *)(in_RDI + 0x18) = lVar1 + 8;
        *(undefined4 *)(lVar1 + 4) = 0xffffffff;
      }
      lua_pushlstring(in_stack_fffffffffffffff8,
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),in_RDI);
    }
    else {
      local_1c = in_ESI & 0x7f;
      lVar1 = *(long *)(in_RDI + 0x18);
      *(long *)(in_RDI + 0x18) = lVar1 + 8;
      *(undefined4 *)(lVar1 + 4) = 0xffffffff;
      lua_pushlstring(in_stack_fffffffffffffff8,
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),in_RDI);
    }
    pdVar2 = *(double **)(in_RDI + 0x18);
    *(double **)(in_RDI + 0x18) = pdVar2 + 1;
    *pdVar2 = (double)(int)local_1c;
    iVar3 = 3;
  }
  return iVar3;
}

Assistant:

LUALIB_API int luaL_execresult(lua_State *L, int stat)
{
  if (stat != -1) {
#if LJ_TARGET_POSIX
    if (WIFSIGNALED(stat)) {
      stat = WTERMSIG(stat);
      setnilV(L->top++);
      lua_pushliteral(L, "signal");
    } else {
      if (WIFEXITED(stat))
	stat = WEXITSTATUS(stat);
      if (stat == 0)
	setboolV(L->top++, 1);
      else
	setnilV(L->top++);
      lua_pushliteral(L, "exit");
    }
#else
    if (stat == 0)
      setboolV(L->top++, 1);
    else
      setnilV(L->top++);
    lua_pushliteral(L, "exit");
#endif
    setintV(L->top++, stat);
    return 3;
  }
  return luaL_fileresult(L, 0, NULL);
}